

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O3

bool __thiscall
ON_BinaryArchive::Write3dmGroupComponent(ON_BinaryArchive *this,ON_ModelComponent *model_component)

{
  bool bVar1;
  ON_Group *group;
  
  group = ON_Group::Cast(&model_component->super_ON_Object);
  if (group != (ON_Group *)0x0) {
    bVar1 = Write3dmGroup(this,group);
    return bVar1;
  }
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
             ,0x2894,"","model_component parameter is not a group component.");
  return false;
}

Assistant:

bool ON_BinaryArchive::Write3dmGroupComponent( 
  const ON_ModelComponent* model_component 
  )
{
  bool rc = false;
  for (;;)
  {
    const ON_Group* group = ON_Group::Cast(model_component);
    if (nullptr == group)
    {
      ON_ERROR("model_component parameter is not a group component.");
      break;
    }
    rc = Write3dmGroup(*group);
    break;
  }
  return rc;
}